

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

void __thiscall spectest::CommandRunner::CommandRunner(CommandRunner *this)

{
  char *pcVar1;
  Limits limits;
  Limits limits_00;
  Value value;
  Value value_00;
  Value value_01;
  Value value_02;
  initializer_list<wabt::Type> __l;
  initializer_list<wabt::Type> __l_00;
  initializer_list<wabt::Type> __l_01;
  initializer_list<wabt::Type> __l_02;
  initializer_list<wabt::Type> __l_03;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  __1 *local_830;
  allocator local_7c9;
  key_type local_7c8;
  anon_union_16_6_113bff37_for_Value_0 local_7a8;
  undefined8 local_798;
  ValueType local_78c;
  GlobalType local_788;
  Ptr local_770;
  allocator local_751;
  key_type local_750;
  anon_union_16_6_113bff37_for_Value_0 local_730;
  undefined8 local_720;
  ValueType local_714;
  GlobalType local_710;
  Ptr local_6f8;
  allocator local_6d9;
  key_type local_6d8;
  anon_union_16_6_113bff37_for_Value_0 local_6b8;
  undefined8 local_6a8;
  ValueType local_69c;
  GlobalType local_698;
  Ptr local_680;
  allocator local_661;
  key_type local_660;
  anon_union_16_6_113bff37_for_Value_0 local_640;
  undefined8 local_630;
  ValueType local_624;
  GlobalType local_620;
  Ptr local_608;
  allocator local_5e9;
  key_type local_5e8;
  Limits local_5c8;
  MemoryType local_5b0;
  Ptr local_588;
  allocator local_569;
  key_type local_568;
  Limits local_548;
  ValueType local_52c;
  TableType local_528;
  Ptr local_500;
  allocator local_4e1;
  key_type local_4e0;
  undefined1 local_4c0 [104];
  Callback local_458;
  FuncType local_438;
  Ptr local_3f8;
  undefined1 local_3e0 [8];
  string import_name;
  anon_struct_72_2_3f8ecaa8 *print;
  anon_struct_72_2_3f8ecaa8 *__end1;
  anon_struct_72_2_3f8ecaa8 *__begin1;
  anon_struct_72_2_3f8ecaa8 (*__range1) [6];
  allocator<wabt::Type> local_381;
  Type local_380;
  Type TStack_37c;
  iterator local_378;
  size_type local_370;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_368;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_350;
  allocator<wabt::Type> local_331;
  Type local_330;
  Type TStack_32c;
  iterator local_328;
  size_type local_320;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_318;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_300;
  allocator<wabt::Type> local_2e5;
  Type local_2e4;
  iterator local_2e0;
  size_type local_2d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2d0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2b8;
  allocator<wabt::Type> local_29d;
  Type local_29c;
  iterator local_298;
  size_type local_290;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_288;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_270;
  allocator<wabt::Type> local_255;
  Type local_254;
  iterator local_250;
  size_type local_248;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_240;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_228;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_210;
  undefined1 local_1f8 [8];
  anon_struct_72_2_3f8ecaa8 print_funcs [6];
  allocator local_39;
  key_type local_38;
  mapped_type *local_18;
  mapped_type *spectest;
  CommandRunner *this_local;
  
  spectest = (mapped_type *)this;
  wabt::interp::Store::Store(&this->store_,&s_features);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
  ::map(&this->registry_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
  ::map(&this->instances_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
  ::map(&this->last_instance_);
  this->passed_ = 0;
  this->total_ = 0;
  std::__cxx11::string::string((string *)&this->source_filename_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"spectest",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
           ::operator[](&this->registry_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_1f8 = (undefined1  [8])0x4018eb;
  local_18 = pmVar2;
  memset(&local_210,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_210);
  memset(&local_228,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_228);
  wabt::interp::FuncType::FuncType((FuncType *)print_funcs,&local_210,&local_228);
  print_funcs[0].type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_2a7be;
  wabt::Type::Type(&local_254,I32);
  local_250 = &local_254;
  local_248 = 1;
  std::allocator<wabt::Type>::allocator(&local_255);
  __l_03._M_len = local_248;
  __l_03._M_array = local_250;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_240,__l_03,&local_255);
  memset(&local_270,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_270);
  wabt::interp::FuncType::FuncType((FuncType *)(print_funcs + 1),&local_240,&local_270);
  print_funcs[1].type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_2a7ca;
  wabt::Type::Type(&local_29c,F32);
  local_298 = &local_29c;
  local_290 = 1;
  std::allocator<wabt::Type>::allocator(&local_29d);
  __l_02._M_len = local_290;
  __l_02._M_array = local_298;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_288,__l_02,&local_29d);
  memset(&local_2b8,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_2b8);
  wabt::interp::FuncType::FuncType((FuncType *)(print_funcs + 2),&local_288,&local_2b8);
  print_funcs[2].type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_2a7d6;
  wabt::Type::Type(&local_2e4,F64);
  local_2e0 = &local_2e4;
  local_2d8 = 1;
  std::allocator<wabt::Type>::allocator(&local_2e5);
  __l_01._M_len = local_2d8;
  __l_01._M_array = local_2e0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_2d0,__l_01,&local_2e5);
  memset(&local_300,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_300);
  wabt::interp::FuncType::FuncType((FuncType *)(print_funcs + 3),&local_2d0,&local_300);
  print_funcs[3].type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_2a7e2;
  wabt::Type::Type(&local_330,I32);
  wabt::Type::Type(&TStack_32c,F32);
  local_328 = &local_330;
  local_320 = 2;
  std::allocator<wabt::Type>::allocator(&local_331);
  __l_00._M_len = local_320;
  __l_00._M_array = local_328;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_318,__l_00,&local_331);
  memset(&local_350,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_350);
  wabt::interp::FuncType::FuncType((FuncType *)(print_funcs + 4),&local_318,&local_350);
  print_funcs[4].type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_2a7ee;
  wabt::Type::Type(&local_380,F64);
  wabt::Type::Type(&TStack_37c,F64);
  local_378 = &local_380;
  local_370 = 2;
  std::allocator<wabt::Type>::allocator(&local_381);
  __l._M_len = local_370;
  __l._M_array = local_378;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_368,__l,&local_381);
  memset(&__range1,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&__range1);
  wabt::interp::FuncType::FuncType((FuncType *)(print_funcs + 5),&local_368,(ValueTypes *)&__range1)
  ;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&__range1);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_368);
  std::allocator<wabt::Type>::~allocator(&local_381);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_350);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_318);
  std::allocator<wabt::Type>::~allocator(&local_331);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_300);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_2d0);
  std::allocator<wabt::Type>::~allocator(&local_2e5);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_2b8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_288);
  std::allocator<wabt::Type>::~allocator(&local_29d);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_270);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_240);
  std::allocator<wabt::Type>::~allocator(&local_255);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_228);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_210);
  for (__end1 = (anon_struct_72_2_3f8ecaa8 *)local_1f8;
      __end1 != (anon_struct_72_2_3f8ecaa8 *)
                &print_funcs[5].type.results.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; __end1 = __end1 + 1) {
    import_name.field_2._8_8_ = __end1;
    wabt::StringPrintf_abi_cxx11_((string *)local_3e0,"spectest.%s",__end1->name);
    wabt::interp::FuncType::FuncType(&local_438,(FuncType *)(import_name.field_2._8_8_ + 8));
    std::__cxx11::string::string((string *)local_4c0,(string *)local_3e0);
    CommandRunner()::$_1::__1
              ((__1 *)(local_4c0 + 0x20),(anon_struct_72_2_3f8ecaa8 *)import_name.field_2._8_8_);
    std::
    function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
    ::function<spectest::CommandRunner::CommandRunner()::__0,void>
              ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
                *)&local_458,(anon_class_104_2_32c3fac7 *)local_4c0);
    wabt::interp::HostFunc::New(&local_3f8,&this->store_,&local_438,&local_458);
    pmVar2 = local_18;
    pcVar1 = *(char **)import_name.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e0,pcVar1,&local_4e1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
             ::operator[](pmVar2,&local_4e0);
    wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar3,&local_3f8);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr(&local_3f8);
    std::
    function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
    ::~function(&local_458);
    CommandRunner()::$_0::~__0((__0 *)local_4c0);
    wabt::interp::FuncType::~FuncType(&local_438);
    std::__cxx11::string::~string((string *)local_3e0);
  }
  wabt::Type::Type(&local_52c,FuncRef);
  wabt::Limits::Limits(&local_548,10,0x14);
  limits.max = local_548.max;
  limits.initial = local_548.initial;
  limits.has_max = local_548.has_max;
  limits.is_shared = local_548.is_shared;
  limits.is_64 = local_548.is_64;
  limits._19_5_ = local_548._19_5_;
  wabt::interp::TableType::TableType(&local_528,local_52c,limits);
  wabt::interp::Table::New(&local_500,&this->store_,&local_528);
  pmVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"table",&local_569);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](pmVar2,&local_568);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar3,&local_500);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr(&local_500);
  wabt::interp::TableType::~TableType(&local_528);
  wabt::Limits::Limits(&local_5c8,1,2);
  limits_00.max = local_5c8.max;
  limits_00.initial = local_5c8.initial;
  limits_00.has_max = local_5c8.has_max;
  limits_00.is_shared = local_5c8.is_shared;
  limits_00.is_64 = local_5c8.is_64;
  limits_00._19_5_ = local_5c8._19_5_;
  wabt::interp::MemoryType::MemoryType(&local_5b0,limits_00);
  wabt::interp::Memory::New(&local_588,&this->store_,&local_5b0);
  pmVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e8,"memory",&local_5e9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](pmVar2,&local_5e8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar3,&local_588);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  wabt::interp::RefPtr<wabt::interp::Memory>::~RefPtr(&local_588);
  wabt::interp::MemoryType::~MemoryType(&local_5b0);
  wabt::Type::Type(&local_624,I32);
  wabt::interp::GlobalType::GlobalType(&local_620,local_624,Const);
  wabt::interp::Value::Make((Value *)&local_640.v128_,0x29a);
  value.field_0._8_8_ = local_640._8_8_;
  value.field_0.i64_ = local_640.i64_;
  value._16_8_ = local_630;
  wabt::interp::Global::New(&local_608,&this->store_,&local_620,value);
  pmVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_660,"global_i32",&local_661);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](pmVar2,&local_660);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar3,&local_608);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  wabt::interp::RefPtr<wabt::interp::Global>::~RefPtr(&local_608);
  wabt::interp::GlobalType::~GlobalType(&local_620);
  wabt::Type::Type(&local_69c,I64);
  wabt::interp::GlobalType::GlobalType(&local_698,local_69c,Const);
  wabt::interp::Value::Make((Value *)&local_6b8.v128_,0x29a);
  value_00.field_0._8_8_ = local_6b8._8_8_;
  value_00.field_0.i64_ = local_6b8.i64_;
  value_00._16_8_ = local_6a8;
  wabt::interp::Global::New(&local_680,&this->store_,&local_698,value_00);
  pmVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6d8,"global_i64",&local_6d9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](pmVar2,&local_6d8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar3,&local_680);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  wabt::interp::RefPtr<wabt::interp::Global>::~RefPtr(&local_680);
  wabt::interp::GlobalType::~GlobalType(&local_698);
  wabt::Type::Type(&local_714,F32);
  wabt::interp::GlobalType::GlobalType(&local_710,local_714,Const);
  wabt::interp::Value::Make((Value *)&local_730.v128_,666.0);
  value_01.field_0._8_8_ = local_730._8_8_;
  value_01.field_0.i64_ = local_730.i64_;
  value_01._16_8_ = local_720;
  wabt::interp::Global::New(&local_6f8,&this->store_,&local_710,value_01);
  pmVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_750,"global_f32",&local_751);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](pmVar2,&local_750);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar3,&local_6f8);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  wabt::interp::RefPtr<wabt::interp::Global>::~RefPtr(&local_6f8);
  wabt::interp::GlobalType::~GlobalType(&local_710);
  wabt::Type::Type(&local_78c,F64);
  wabt::interp::GlobalType::GlobalType(&local_788,local_78c,Const);
  wabt::interp::Value::Make((Value *)&local_7a8.v128_,666.0);
  value_02.field_0._8_8_ = local_7a8._8_8_;
  value_02.field_0.i64_ = local_7a8.i64_;
  value_02._16_8_ = local_798;
  wabt::interp::Global::New(&local_770,&this->store_,&local_788,value_02);
  pmVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c8,"global_f64",&local_7c9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](pmVar2,&local_7c8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar3,&local_770);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  wabt::interp::RefPtr<wabt::interp::Global>::~RefPtr(&local_770);
  wabt::interp::GlobalType::~GlobalType(&local_788);
  local_830 = (__1 *)&print_funcs[5].type.results.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  do {
    local_830 = local_830 + -0x48;
    CommandRunner()::$_1::~__1(local_830);
  } while (local_830 != (__1 *)local_1f8);
  return;
}

Assistant:

CommandRunner::CommandRunner() : store_(s_features) {
  auto&& spectest = registry_["spectest"];

  // Initialize print functions for the spec test.
  struct {
    const char* name;
    interp::FuncType type;
  } const print_funcs[] = {
      {"print", interp::FuncType{{}, {}}},
      {"print_i32", interp::FuncType{{ValueType::I32}, {}}},
      {"print_f32", interp::FuncType{{ValueType::F32}, {}}},
      {"print_f64", interp::FuncType{{ValueType::F64}, {}}},
      {"print_i32_f32", interp::FuncType{{ValueType::I32, ValueType::F32}, {}}},
      {"print_f64_f64", interp::FuncType{{ValueType::F64, ValueType::F64}, {}}},
  };

  for (auto&& print : print_funcs) {
    auto import_name = StringPrintf("spectest.%s", print.name);
    spectest[print.name] = HostFunc::New(
        store_, print.type,
        [=](Thread& inst, const Values& params, Values& results,
            Trap::Ptr* trap) -> wabt::Result {
          printf("called host ");
          WriteCall(s_stdout_stream.get(), import_name, print.type, params,
                    results, *trap);
          return wabt::Result::Ok;
        });
  }

  spectest["table"] =
      interp::Table::New(store_, TableType{ValueType::FuncRef, Limits{10, 20}});

  spectest["memory"] = interp::Memory::New(store_, MemoryType{Limits{1, 2}});

  spectest["global_i32"] = interp::Global::New(
      store_, GlobalType{ValueType::I32, Mutability::Const}, Value::Make(u32{666}));
  spectest["global_i64"] = interp::Global::New(
      store_, GlobalType{ValueType::I64, Mutability::Const}, Value::Make(u64{666}));
  spectest["global_f32"] = interp::Global::New(
      store_, GlobalType{ValueType::F32, Mutability::Const}, Value::Make(f32{666}));
  spectest["global_f64"] = interp::Global::New(
      store_, GlobalType{ValueType::F64, Mutability::Const}, Value::Make(f64{666}));
}